

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgrayraster.c
# Opt level: O0

void gray_set_cell(PWorker worker,TCoord ex,TCoord ey)

{
  long lVar1;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  bool bVar2;
  long local_10;
  
  lVar1 = in_RDX - in_RDI[4];
  local_10 = in_RSI;
  if (in_RDI[3] < in_RSI) {
    local_10 = in_RDI[3];
  }
  local_10 = local_10 - in_RDI[2];
  if (local_10 < 0) {
    local_10 = -1;
  }
  if ((local_10 != *in_RDI) || (lVar1 != in_RDI[1])) {
    if (*(int *)((long)in_RDI + 0x4c) == 0) {
      gray_record_cell((PWorker)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
    }
    in_RDI[8] = 0;
    *(undefined4 *)(in_RDI + 9) = 0;
    *in_RDI = local_10;
    in_RDI[1] = lVar1;
  }
  bVar2 = true;
  if ((uint)lVar1 < (uint)in_RDI[7]) {
    bVar2 = in_RDI[6] <= local_10;
  }
  *(uint *)((long)in_RDI + 0x4c) = (uint)bVar2;
  return;
}

Assistant:

static void
  gray_set_cell( RAS_ARG_ TCoord  ex,
                          TCoord  ey )
  {
    /* Move the cell pointer to a new position.  We set the `invalid'      */
    /* flag to indicate that the cell isn't part of those we're interested */
    /* in during the render phase.  This means that:                       */
    /*                                                                     */
    /* . the new vertical position must be within min_ey..max_ey-1.        */
    /* . the new horizontal position must be strictly less than max_ex     */
    /*                                                                     */
    /* Note that if a cell is to the left of the clipping region, it is    */
    /* actually set to the (min_ex-1) horizontal position.                 */

    /* All cells that are on the left of the clipping region go to the */
    /* min_ex - 1 horizontal position.                                 */
    ey -= ras.min_ey;

    if ( ex > ras.max_ex )
      ex = ras.max_ex;

    ex -= ras.min_ex;
    if ( ex < 0 )
      ex = -1;

    /* are we moving to a different cell ? */
    if ( ex != ras.ex || ey != ras.ey )
    {
      /* record the current one if it is valid */
      if ( !ras.invalid )
        gray_record_cell( RAS_VAR );

      ras.area  = 0;
      ras.cover = 0;
      ras.ex    = ex;
      ras.ey    = ey;
    }

    ras.invalid = ( (unsigned int)ey >= (unsigned int)ras.count_ey ||
                                  ex >= ras.count_ex           );
  }